

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O3

Iterator * __thiscall
wasm::
SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
::Iterator::operator++(Iterator *this)

{
  unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
  *this_00;
  pointer *ppWVar1;
  size_type sVar2;
  iterator __position;
  optional<wasm::HeapType> *poVar3;
  pointer pHVar4;
  vector<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
  *this_01;
  pointer pWVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  __node_ptr __node;
  size_t __code;
  __node_ptr p_Var8;
  _Storage<wasm::HeapType,_true> _Var9;
  const_iterator cVar10;
  pointer pWVar11;
  HeapType *pHVar12;
  ulong uVar13;
  key_type *__key;
  ulong uVar14;
  pointer __ptr;
  pointer pHVar15;
  size_t __n_elt;
  pointer pWVar16;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  *pSVar17;
  bool bVar18;
  HeapType local_c0;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  *local_b8;
  anon_struct_8_0_00000001_for___align local_b0;
  pointer local_a8;
  optional<wasm::HeapType> *local_a0;
  vector<wasm::HeapType,std::allocator<wasm::HeapType>> *local_98;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_90;
  key_type local_78;
  SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
  *local_70;
  vector<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
  *local_68;
  Iterator *local_60;
  undefined1 local_58 [8];
  Iterator __begin0;
  
  _Var9 = (_Storage<wasm::HeapType,_true>)
          (_Storage<wasm::HeapType,_true>)
          __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id;
  local_58 = (undefined1  [8])(this->scc).parent;
  __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)
       ((ulong)__begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload & 0xffffffffffffff00);
  if ((((SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
         *)local_58)->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged == true) {
    __begin0.parent =
         (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
          *)(((SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
               *)local_58)->stack).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].id;
    __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._1_7_ = _Var9._1_7_;
    __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = 1;
  }
  do {
    if (*(bool *)((long)local_58 + 0x90) == false) break;
    SCC::Iterator::operator++((Iterator *)local_58);
  } while (local_58 != (undefined1  [8])0x0);
  pSVar17 = (this->scc).parent;
  pHVar12 = (pSVar17->inputIt)._M_current;
  pWVar11 = (pSVar17->workStack).
            super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pWVar16 = (pSVar17->workStack).
            super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = this;
  if (pWVar11 != pWVar16 || (pSVar17->inputEnd)._M_current != pHVar12) {
    local_68 = &pSVar17->workStack;
    this_00 = &pSVar17->elementInfo;
    local_98 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&pSVar17->stack;
    local_a0 = &pSVar17->currParent;
    local_b8 = pSVar17 + 1;
    local_70 = pSVar17;
    do {
      bVar18 = pWVar11 == pWVar16;
      pWVar5 = pWVar11;
      pWVar11 = pWVar16;
      if (bVar18) {
        (pSVar17->inputIt)._M_current = pHVar12 + 1;
        local_58 = (undefined1  [8])pHVar12->id;
        __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload =
             (_Storage<wasm::HeapType,_true>)
             ((ulong)__begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._M_payload & 0xffffffffffffff00);
        __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
        std::
        vector<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
        ::push_back(local_68,(value_type *)local_58);
        pWVar5 = (pSVar17->workStack).
                 super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pWVar11 = (pSVar17->workStack).
                  super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      pWVar16 = pWVar11;
      if (pWVar5 != pWVar11) {
        do {
          pWVar11 = pWVar16 + -1;
          if (pWVar16[-1].processedChildren == false) {
            sVar2 = (pSVar17->elementInfo)._M_h._M_element_count;
            local_b0 = (anon_struct_8_0_00000001_for___align)(pWVar11->item).id;
            local_a8 = pWVar11;
            __node = (__node_ptr)operator_new(0x30);
            (__node->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
            (__node->
            super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
            ).
            super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
            ._M_storage._M_storage.__align = local_b0;
            *(size_type *)
             ((long)&(__node->
                     super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
                     ._M_storage._M_storage + 8) = sVar2;
            *(size_type *)
             ((long)&(__node->
                     super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
                     ._M_storage._M_storage + 0x10) = sVar2;
            (__node->
            super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
            ).
            super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
            ._M_storage._M_storage.__data[0x18] = '\x01';
            __code = std::hash<wasm::HeapType>::operator()
                               ((hash<wasm::HeapType> *)this_00,
                                (HeapType *)
                                &__node->
                                 super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
                               );
            sVar2 = (pSVar17->elementInfo)._M_h._M_bucket_count;
            __key = (key_type *)(__code % sVar2);
            __n_elt = __code;
            p_Var8 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::_M_find_node((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                     *)(pSVar17->elementInfo)._M_h._M_buckets,sVar2,__key,
                                    (__hash_code)
                                    (__node->
                                    super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
                                    ._M_storage._M_storage.__align);
            if (p_Var8 != (__node_ptr)0x0) {
              operator_delete(__node,0x30);
              pSVar17 = local_70;
              if ((p_Var8->
                  super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
                  ).
                  super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
                  ._M_storage._M_storage.__data[0x18] == '\x01') {
                if (pWVar16[-1].parent.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
                  __assert_fail("work.parent",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/strongly_connected_components.h"
                                ,0x6e,
                                "bool wasm::SCCs<__gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, wasm::(anonymous namespace)::TypeSCCs>::stepToNextGroup() [It = __gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, Class = wasm::(anonymous namespace)::TypeSCCs]"
                               );
                }
                pmVar6 = std::
                         unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
                         ::operator[](this_00,(key_type *)&pWVar16[-1].parent);
                uVar13 = *(ulong *)((long)&(p_Var8->
                                           super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_true>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>
                                           ._M_storage._M_storage + 8);
                uVar14 = pmVar6->lowlink;
                if (uVar13 < pmVar6->lowlink) {
                  uVar14 = uVar13;
                }
                pmVar6->lowlink = uVar14;
                pSVar17 = local_70;
              }
              goto LAB_0097b9de;
            }
            std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_M_insert_unique_node(&this_00->_M_h,(size_type)__key,__code,__node,__n_elt);
            pSVar17 = local_70;
            pWVar11 = local_a8;
            __position._M_current =
                 (local_70->stack).
                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (local_70->stack).
                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
              _M_realloc_insert<wasm::HeapType_const&>(local_98,__position,&local_a8->item);
              _Var9 = (_Storage<wasm::HeapType,_true>)(pWVar11->item).id;
            }
            else {
              _Var9 = (_Storage<wasm::HeapType,_true>)(local_a8->item).id;
              (__position._M_current)->id = (uintptr_t)_Var9;
              (local_70->stack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            poVar3 = local_a0;
            pWVar16[-1].processedChildren = true;
            if ((pSVar17->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
              (pSVar17->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_engaged = true;
            }
            (local_a0->super__Optional_base<wasm::HeapType,_true,_true>)._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload = _Var9;
            local_c0.id = (pWVar11->item).id;
            HeapType::getReferencedHeapTypes(&local_90,&local_c0);
            this_01 = local_68;
            pHVar4 = local_90.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            for (pHVar15 = local_90.
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Vector_impl_data._M_start; pHVar15 != pHVar4;
                pHVar15 = pHVar15 + 1) {
              local_78.id = pHVar15->id;
              cVar10 = std::
                       _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)local_b8,&local_78);
              if (cVar10.super__Node_iterator_base<wasm::HeapType,_true>._M_cur !=
                  (__node_type *)0x0) {
                if ((pSVar17->currParent).super__Optional_base<wasm::HeapType,_true,_true>.
                    _M_payload.super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
                  __assert_fail("currParent",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/strongly_connected_components.h"
                                ,0xa9,
                                "void wasm::SCCs<__gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, wasm::(anonymous namespace)::TypeSCCs>::push(const T &) [It = __gnu_cxx::__normal_iterator<const wasm::HeapType *, std::vector<wasm::HeapType>>, Class = wasm::(anonymous namespace)::TypeSCCs]"
                               );
                }
                local_58 = (undefined1  [8])local_78.id;
                __begin0.parent =
                     *(SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                       **)&(poVar3->super__Optional_base<wasm::HeapType,_true,_true>)._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._M_payload;
                __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload =
                     *(_Storage<wasm::HeapType,_true> *)
                      &(poVar3->super__Optional_base<wasm::HeapType,_true,_true>)._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_engaged;
                __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
                std::
                vector<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                ::push_back(this_01,(value_type *)local_58);
              }
            }
            if (local_90.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                .super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_90.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_90.
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_90.
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((pSVar17->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged == true) {
              (pSVar17->currParent).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
            }
          }
          else {
            pmVar6 = std::
                     unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
                     ::operator[](this_00,&pWVar11->item);
            if (pWVar16[-1].parent.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged == true) {
              pmVar7 = std::
                       unordered_map<wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::ElementInfo>_>_>
                       ::operator[](this_00,(key_type *)&pWVar16[-1].parent);
              uVar13 = pmVar7->lowlink;
              if (pmVar6->lowlink < pmVar7->lowlink) {
                uVar13 = pmVar6->lowlink;
              }
              pmVar7->lowlink = uVar13;
            }
            if (pmVar6->index == pmVar6->lowlink) {
              _Var9 = (_Storage<wasm::HeapType,_true>)(pWVar11->item).id;
              if ((pSVar17->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
                (pSVar17->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged = true;
              }
              (pSVar17->currRoot).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload = _Var9;
              ppWVar1 = &(pSVar17->workStack).
                         super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppWVar1 = *ppWVar1 + -1;
              return local_60;
            }
LAB_0097b9de:
            ppWVar1 = &(pSVar17->workStack).
                       super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppWVar1 = *ppWVar1 + -1;
          }
          pWVar11 = (pSVar17->workStack).
                    super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pWVar16 = (pSVar17->workStack).
                    super__Vector_base<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem,_std::allocator<wasm::SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>::WorkItem>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (pWVar11 != pWVar16);
      }
      pHVar12 = (pSVar17->inputIt)._M_current;
    } while ((pHVar12 != (pSVar17->inputEnd)._M_current) || (pWVar11 != pWVar16));
  }
  (local_60->scc).parent =
       (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
        *)0x0;
  return local_60;
}

Assistant:

Iterator& operator++() {
      // Skip the rest of the current SCC, if for some reason it was not
      // consumed.
      for (auto elem : *(*this)) {
        (void)elem;
      }
      if (!scc.parent->stepToNextGroup()) {
        // We are at the end, so mark ourselves as such.
        scc.parent = nullptr;
      }
      return *this;
    }